

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

void __thiscall
basisu::basisu_frontend::compute_selector_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  vector<unsigned_int> *this_00;
  uint *puVar3;
  vector<basisu::vector<unsigned_int>_> *this_01;
  long in_RDI;
  uint *last;
  uint_vec *cluster_indices_1;
  uint32_t i;
  uint32_t parent_cluster_index;
  uint32_t cluster_index_1;
  uint32_t block_index_1;
  uint32_t block_index;
  uint32_t cluster_indices_iter;
  vector<unsigned_int> *cluster_indices;
  int cluster_index;
  uint_vec block_selector_cluster_indices;
  size_t in_stack_fffffffffffffef8;
  vector<basisu::vector<unsigned_int>_> *in_stack_ffffffffffffff00;
  uint *in_stack_ffffffffffffff08;
  vector<basisu::vector<unsigned_int>_> *in_stack_ffffffffffffff10;
  uint uVar4;
  vector<unsigned_int> *in_stack_ffffffffffffff48;
  vector<unsigned_int> *in_stack_ffffffffffffff50;
  undefined4 local_50;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_1c;
  
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_1c = 0;
  while( true ) {
    uVar1 = vector<basisu::vector<unsigned_int>_>::size
                      ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120));
    if ((int)uVar1 <= (int)local_1c) break;
    this_00 = vector<basisu::vector<unsigned_int>_>::operator[]
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_3c = 0;
    while( true ) {
      uVar1 = vector<unsigned_int>::size(this_00);
      if (uVar1 <= local_3c) break;
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      puVar3 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8);
      *puVar3 = local_1c;
      local_3c = local_3c + 1;
    }
    local_1c = local_1c + 1;
  }
  vector<basisu::vector<unsigned_int>_>::resize
            (in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
             SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
  vector<basisu::vector<unsigned_int>_>::size
            ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x140));
  vector<basisu::vector<unsigned_int>_>::resize
            (in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
             SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
  for (local_44 = 0; local_44 < *(uint *)(in_RDI + 0x40); local_44 = local_44 + 1) {
    vector<unsigned_int>::operator[]
              ((vector<unsigned_int> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff50 =
         (vector<unsigned_int> *)
         vector<unsigned_char>::operator[]
                   ((vector<unsigned_char> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff48 =
         vector<basisu::vector<unsigned_int>_>::operator[]
                   (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  local_50 = 0;
  while( true ) {
    uVar4 = local_50;
    uVar1 = vector<basisu::vector<unsigned_int>_>::size
                      ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x160));
    if (uVar1 <= uVar4) break;
    this_01 = (vector<basisu::vector<unsigned_int>_> *)
              vector<basisu::vector<unsigned_int>_>::operator[]
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)this_01);
    if (uVar2 == 0) {
      handle_verify_failure(0);
    }
    vector_sort<basisu::vector<unsigned_int>>((vector<unsigned_int> *)in_stack_ffffffffffffff00);
    vector<unsigned_int>::begin((vector<unsigned_int> *)this_01);
    vector<unsigned_int>::end((vector<unsigned_int> *)this_01);
    in_stack_ffffffffffffff08 =
         std::unique<unsigned_int*>((uint *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff10 =
         (vector<basisu::vector<unsigned_int>_> *)
         vector<unsigned_int>::end((vector<unsigned_int> *)this_01);
    vector<unsigned_int>::erase
              (in_stack_ffffffffffffff50,(uint *)in_stack_ffffffffffffff48,
               (uint *)CONCAT44(uVar1,uVar4));
    local_50 = local_50 + 1;
    in_stack_ffffffffffffff00 = this_01;
  }
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void basisu_frontend::compute_selector_clusters_within_each_parent_cluster()
	{
		uint_vec block_selector_cluster_indices(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_selector_cluster_block_indices.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_selector_cluster_block_indices[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter];
				
				block_selector_cluster_indices[block_index] = cluster_index;

			} // cluster_indices_iter

		} // cluster_index

		m_selector_clusters_within_each_parent_cluster.resize(0);
		m_selector_clusters_within_each_parent_cluster.resize(m_selector_parent_cluster_block_indices.size());

		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = block_selector_cluster_indices[block_index];
			const uint32_t parent_cluster_index = m_block_parent_selector_cluster[block_index];

			m_selector_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_selector_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_selector_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}